

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

TPZFMatrix<long_double> * __thiscall
TPZFMatrix<long_double>::operator*=(TPZFMatrix<long_double> *this,longdouble value)

{
  longdouble *plVar1;
  int64_t iVar2;
  int64_t iVar3;
  TPZFMatrix<long_double> *in_RDI;
  longdouble in_stack_00000008;
  longdouble *dstlast;
  longdouble *dst;
  int64_t size;
  longdouble *local_28;
  
  iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RDI);
  iVar3 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RDI);
  plVar1 = in_RDI->fElem;
  local_28 = plVar1;
  while (local_28 < plVar1 + iVar2 * iVar3) {
    *local_28 = *local_28 * in_stack_00000008;
    local_28 = local_28 + 1;
  }
  return in_RDI;
}

Assistant:

TPZFMatrix<TVar> &TPZFMatrix<TVar>::operator*=( const TVar value ) {
    int64_t size = ((int64_t)this->Rows()) * this->Cols();
    TVar * dst = fElem, *dstlast = dst+size;
    while ( dst < dstlast ) *dst++ *= value;
    return( *this );
}